

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# validator.cc
# Opt level: O0

Result __thiscall wabt::anon_unknown_7::Validator::CheckModule(Validator *this,Module *module)

{
  bool bVar1;
  string *psVar2;
  bool bVar3;
  ModuleFieldType MVar4;
  Index IVar5;
  ExceptionModuleField *pEVar6;
  FuncModuleField *pFVar7;
  GlobalModuleField *pGVar8;
  ImportModuleField *pIVar9;
  pointer import;
  ExportModuleField *pEVar10;
  TableModuleField *pTVar11;
  MemoryModuleField *pMVar12;
  StartModuleField *pSVar13;
  Func *local_70;
  Func *start_func;
  ModuleField *field;
  intrusive_list<wabt::ModuleField> *local_58;
  undefined1 local_50 [8];
  const_iterator __end2;
  const_iterator __begin2;
  ModuleFieldList *__range2;
  bool seen_start;
  Module *module_local;
  Validator *this_local;
  
  bVar1 = false;
  this->current_module_ = module;
  this->current_table_index_ = 0;
  this->current_memory_index_ = 0;
  this->current_global_index_ = 0;
  this->num_imported_globals_ = 0;
  this->current_except_index_ = 0;
  join_0x00000010_0x00000000_ = intrusive_list<wabt::ModuleField>::begin(&module->fields);
  _local_50 = intrusive_list<wabt::ModuleField>::end(&module->fields);
  while( true ) {
    field = (ModuleField *)local_50;
    local_58 = __end2.list_;
    bVar3 = intrusive_list<wabt::ModuleField>::const_iterator::operator!=
                      ((const_iterator *)&__end2.node_,_local_50);
    if (!bVar3) break;
    start_func = (Func *)intrusive_list<wabt::ModuleField>::const_iterator::operator*
                                   ((const_iterator *)&__end2.node_);
    MVar4 = ModuleField::type((ModuleField *)start_func);
    switch(MVar4) {
    case Func:
      psVar2 = &start_func->name;
      pFVar7 = cast<wabt::FuncModuleField,wabt::ModuleField>((ModuleField *)start_func);
      CheckFunc(this,(Location *)((long)&psVar2->field_2 + 8),&pFVar7->func);
      break;
    case Global:
      psVar2 = &start_func->name;
      pGVar8 = cast<wabt::GlobalModuleField,wabt::ModuleField>((ModuleField *)start_func);
      CheckGlobal(this,(Location *)((long)&psVar2->field_2 + 8),&pGVar8->global);
      this->current_global_index_ = this->current_global_index_ + 1;
      break;
    case Import:
      psVar2 = &start_func->name;
      pIVar9 = cast<wabt::ImportModuleField,wabt::ModuleField>((ModuleField *)start_func);
      import = std::unique_ptr<wabt::Import,_std::default_delete<wabt::Import>_>::get
                         (&pIVar9->import);
      CheckImport(this,(Location *)((long)&psVar2->field_2 + 8),import);
      break;
    case Export:
      psVar2 = &start_func->name;
      pEVar10 = cast<wabt::ExportModuleField,wabt::ModuleField>((ModuleField *)start_func);
      CheckExport(this,(Location *)((long)&psVar2->field_2 + 8),&pEVar10->export_);
      break;
    case FuncType:
      break;
    case Table:
      psVar2 = &start_func->name;
      pTVar11 = cast<wabt::TableModuleField,wabt::ModuleField>((ModuleField *)start_func);
      CheckTable(this,(Location *)((long)&psVar2->field_2 + 8),&pTVar11->table);
      this->current_table_index_ = this->current_table_index_ + 1;
      break;
    case ElemSegment:
      break;
    case Memory:
      psVar2 = &start_func->name;
      pMVar12 = cast<wabt::MemoryModuleField,wabt::ModuleField>((ModuleField *)start_func);
      CheckMemory(this,(Location *)((long)&psVar2->field_2 + 8),&pMVar12->memory);
      this->current_memory_index_ = this->current_memory_index_ + 1;
      break;
    case DataSegment:
      break;
    case Start:
      if (bVar1) {
        PrintError(this,(Location *)((long)&(start_func->name).field_2 + 8),
                   "only one start function allowed");
      }
      local_70 = (Func *)0x0;
      pSVar13 = cast<wabt::StartModuleField,wabt::ModuleField>((ModuleField *)start_func);
      CheckFuncVar(this,&pSVar13->start,&local_70);
      if (local_70 != (Func *)0x0) {
        IVar5 = Func::GetNumParams(local_70);
        if (IVar5 != 0) {
          PrintError(this,(Location *)((long)&(start_func->name).field_2 + 8),
                     "start function must be nullary");
        }
        IVar5 = Func::GetNumResults(local_70);
        if (IVar5 != 0) {
          PrintError(this,(Location *)((long)&(start_func->name).field_2 + 8),
                     "start function must not return anything");
        }
      }
      bVar1 = true;
      break;
    case Except:
      this->current_except_index_ = this->current_except_index_ + 1;
      psVar2 = &start_func->name;
      pEVar6 = cast<wabt::ExceptionModuleField,wabt::ModuleField>((ModuleField *)start_func);
      CheckExcept(this,(Location *)((long)&psVar2->field_2 + 8),&pEVar6->except);
    }
    intrusive_list<wabt::ModuleField>::const_iterator::operator++((const_iterator *)&__end2.node_);
  }
  CheckElemSegments(this,module);
  CheckDataSegments(this,module);
  CheckDuplicateExportBindings(this,module);
  return (Result)(this->result_).enum_;
}

Assistant:

Result Validator::CheckModule(const Module* module) {
  bool seen_start = false;

  current_module_ = module;
  current_table_index_ = 0;
  current_memory_index_ = 0;
  current_global_index_ = 0;
  num_imported_globals_ = 0;
  current_except_index_ = 0;

  for (const ModuleField& field : module->fields) {
    switch (field.type()) {
      case ModuleFieldType::Except:
        ++current_except_index_;
        CheckExcept(&field.loc, &cast<ExceptionModuleField>(&field)->except);
        break;

      case ModuleFieldType::Func:
        CheckFunc(&field.loc, &cast<FuncModuleField>(&field)->func);
        break;

      case ModuleFieldType::Global:
        CheckGlobal(&field.loc, &cast<GlobalModuleField>(&field)->global);
        current_global_index_++;
        break;

      case ModuleFieldType::Import:
        CheckImport(&field.loc, cast<ImportModuleField>(&field)->import.get());
        break;

      case ModuleFieldType::Export:
        CheckExport(&field.loc, &cast<ExportModuleField>(&field)->export_);
        break;

      case ModuleFieldType::Table:
        CheckTable(&field.loc, &cast<TableModuleField>(&field)->table);
        current_table_index_++;
        break;

      case ModuleFieldType::ElemSegment:
        // Checked below.
        break;

      case ModuleFieldType::Memory:
        CheckMemory(&field.loc, &cast<MemoryModuleField>(&field)->memory);
        current_memory_index_++;
        break;

      case ModuleFieldType::DataSegment:
        // Checked below.
        break;

      case ModuleFieldType::FuncType:
        break;

      case ModuleFieldType::Start: {
        if (seen_start) {
          PrintError(&field.loc, "only one start function allowed");
        }

        const Func* start_func = nullptr;
        CheckFuncVar(&cast<StartModuleField>(&field)->start, &start_func);
        if (start_func) {
          if (start_func->GetNumParams() != 0) {
            PrintError(&field.loc, "start function must be nullary");
          }

          if (start_func->GetNumResults() != 0) {
            PrintError(&field.loc, "start function must not return anything");
          }
        }
        seen_start = true;
        break;
      }
    }
  }

  CheckElemSegments(module);
  CheckDataSegments(module);
  CheckDuplicateExportBindings(module);

  return result_;
}